

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O1

int array_run_container_intersection_cardinality(array_container_t *src_1,run_container_t *src_2)

{
  int iVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  rle16_t *prVar5;
  uint16_t *puVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ushort uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  
  prVar5 = src_2->runs;
  uVar11 = (uint)prVar5->value;
  iVar3 = src_2->n_runs;
  if ((prVar5->value == 0 && iVar3 == 1) && (prVar5->length == 0xffff)) {
    iVar8 = src_1->cardinality;
  }
  else if (iVar3 == 0) {
    iVar8 = 0;
  }
  else {
    uVar13 = (uint)prVar5->length;
    iVar4 = src_1->cardinality;
    iVar1 = iVar4 + -1;
    lVar12 = 0;
    iVar15 = 0;
    iVar9 = 0;
    iVar8 = iVar1;
    do {
      if (iVar4 <= iVar15) {
        return iVar9;
      }
      puVar6 = src_1->array;
      uVar2 = puVar6[iVar15];
      bVar18 = uVar13 + uVar11 < (uint)uVar2;
      if (bVar18) {
        lVar12 = (long)(int)lVar12;
        do {
          lVar12 = lVar12 + 1;
          iVar17 = iVar15;
          iVar7 = iVar9;
          if (iVar3 == (int)lVar12) goto LAB_0011b192;
          uVar11 = (uint)prVar5[lVar12].value;
          uVar13 = (uint)prVar5[lVar12].length;
          bVar18 = uVar11 + uVar13 < (uint)uVar2;
        } while (bVar18);
      }
      uVar10 = (ushort)uVar11;
      iVar7 = iVar8;
      if (uVar2 < uVar10) {
        iVar8 = iVar15 + 1;
        iVar17 = iVar8;
        if ((iVar8 < iVar4) && (puVar6[iVar8] < uVar10)) {
          iVar15 = iVar15 + 2;
          iVar14 = 0;
          iVar16 = iVar1;
          if (iVar15 < iVar4) {
            iVar17 = 1;
            do {
              iVar16 = iVar15;
              iVar14 = iVar17;
              if (uVar10 <= puVar6[iVar15]) break;
              iVar14 = iVar17 * 2;
              iVar15 = iVar8 + iVar17 * 2;
              iVar16 = iVar1;
              iVar17 = iVar14;
            } while (iVar15 < iVar4);
            iVar14 = iVar14 >> 1;
          }
          iVar17 = iVar16;
          if (((puVar6[iVar16] != uVar10) && (iVar17 = iVar4, uVar10 <= puVar6[iVar16])) &&
             (iVar17 = iVar16, iVar14 + iVar8 + 1 != iVar16)) {
            iVar14 = iVar14 + iVar8;
            do {
              iVar17 = iVar14 + iVar16 >> 1;
              if (puVar6[iVar17] == uVar10) break;
              iVar8 = iVar17;
              if (uVar10 <= puVar6[iVar17]) {
                iVar8 = iVar14;
                iVar16 = iVar17;
              }
              iVar14 = iVar8;
              iVar17 = iVar16;
            } while (iVar14 + 1 != iVar16);
          }
        }
      }
      else {
        iVar9 = iVar9 + 1;
        iVar17 = iVar15 + 1;
      }
LAB_0011b192:
      iVar8 = iVar7;
      iVar15 = iVar17;
    } while (!bVar18);
  }
  return iVar8;
}

Assistant:

int array_run_container_intersection_cardinality(const array_container_t *src_1,
                                                 const run_container_t *src_2) {
    if (run_container_is_full(src_2)) {
        return src_1->cardinality;
    }
    if (src_2->n_runs == 0) {
        return 0;
    }
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    rle16_t rle = src_2->runs[rlepos];
    int32_t newcard = 0;
    while (arraypos < src_1->cardinality) {
        const uint16_t arrayval = src_1->array[arraypos];
        while (rle.value + rle.length <
               arrayval) {  // this will frequently be false
            ++rlepos;
            if (rlepos == src_2->n_runs) {
                return newcard;  // we are done
            }
            rle = src_2->runs[rlepos];
        }
        if (rle.value > arrayval) {
            arraypos = advanceUntil(src_1->array, arraypos, src_1->cardinality,
                                    rle.value);
        } else {
            newcard++;
            arraypos++;
        }
    }
    return newcard;
}